

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O1

bool btSolveDantzigLCP(int n,btScalar *A,btScalar *x,btScalar *b,btScalar *outer_w,int nub,
                      btScalar *lo,btScalar *hi,int *findex,btDantzigScratchMemory *scratchMem)

{
  float fVar1;
  float *pfVar2;
  int *piVar3;
  bool *pbVar4;
  float *pfVar5;
  bool bVar6;
  int iVar7;
  bool bVar8;
  float *pfVar9;
  long lVar10;
  void *pvVar11;
  int *piVar12;
  bool *pbVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  size_t __n;
  int iVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  btScalar bVar22;
  btScalar bVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  btLCP lcp;
  
  s_error = false;
  if (nub < n) {
    uVar21 = n * n;
    iVar16 = (scratchMem->L).m_size;
    if ((iVar16 <= (int)uVar21) && (iVar16 < (int)uVar21)) {
      if ((scratchMem->L).m_capacity < (int)uVar21) {
        if (n == 0) {
          pfVar9 = (float *)0x0;
        }
        else {
          pfVar9 = (float *)btAlignedAllocInternal((ulong)uVar21 << 2,0x10);
        }
        lVar10 = (long)(scratchMem->L).m_size;
        if (0 < lVar10) {
          pfVar2 = (scratchMem->L).m_data;
          lVar15 = 0;
          do {
            pfVar9[lVar15] = pfVar2[lVar15];
            lVar15 = lVar15 + 1;
          } while (lVar10 != lVar15);
        }
        pfVar2 = (scratchMem->L).m_data;
        if (pfVar2 != (float *)0x0) {
          if ((scratchMem->L).m_ownsMemory == true) {
            btAlignedFreeInternal(pfVar2);
          }
          (scratchMem->L).m_data = (float *)0x0;
        }
        (scratchMem->L).m_ownsMemory = true;
        (scratchMem->L).m_data = pfVar9;
        (scratchMem->L).m_capacity = uVar21;
      }
      if (iVar16 < (int)uVar21) {
        memset((scratchMem->L).m_data + iVar16,0,((ulong)uVar21 - (long)iVar16) * 4);
      }
    }
    (scratchMem->L).m_size = uVar21;
    iVar16 = (scratchMem->d).m_size;
    if ((iVar16 <= n) && (iVar16 < n)) {
      if ((scratchMem->d).m_capacity < n) {
        if (n == 0) {
          pfVar9 = (float *)0x0;
        }
        else {
          pfVar9 = (float *)btAlignedAllocInternal((long)n << 2,0x10);
        }
        lVar10 = (long)(scratchMem->d).m_size;
        if (0 < lVar10) {
          pfVar2 = (scratchMem->d).m_data;
          lVar15 = 0;
          do {
            pfVar9[lVar15] = pfVar2[lVar15];
            lVar15 = lVar15 + 1;
          } while (lVar10 != lVar15);
        }
        pfVar2 = (scratchMem->d).m_data;
        if (pfVar2 != (float *)0x0) {
          if ((scratchMem->d).m_ownsMemory == true) {
            btAlignedFreeInternal(pfVar2);
          }
          (scratchMem->d).m_data = (float *)0x0;
        }
        (scratchMem->d).m_ownsMemory = true;
        (scratchMem->d).m_data = pfVar9;
        (scratchMem->d).m_capacity = n;
      }
      if (iVar16 < n) {
        memset((scratchMem->d).m_data + iVar16,0,((long)n - (long)iVar16) * 4);
      }
    }
    (scratchMem->d).m_size = n;
    iVar16 = (scratchMem->delta_w).m_size;
    if ((iVar16 <= n) && (iVar16 < n)) {
      if ((scratchMem->delta_w).m_capacity < n) {
        if (n == 0) {
          pfVar9 = (float *)0x0;
        }
        else {
          pfVar9 = (float *)btAlignedAllocInternal((long)n << 2,0x10);
        }
        lVar10 = (long)(scratchMem->delta_w).m_size;
        if (0 < lVar10) {
          pfVar2 = (scratchMem->delta_w).m_data;
          lVar15 = 0;
          do {
            pfVar9[lVar15] = pfVar2[lVar15];
            lVar15 = lVar15 + 1;
          } while (lVar10 != lVar15);
        }
        pfVar2 = (scratchMem->delta_w).m_data;
        if (pfVar2 != (float *)0x0) {
          if ((scratchMem->delta_w).m_ownsMemory == true) {
            btAlignedFreeInternal(pfVar2);
          }
          (scratchMem->delta_w).m_data = (float *)0x0;
        }
        (scratchMem->delta_w).m_ownsMemory = true;
        (scratchMem->delta_w).m_data = pfVar9;
        (scratchMem->delta_w).m_capacity = n;
      }
      if (iVar16 < n) {
        memset((scratchMem->delta_w).m_data + iVar16,0,((long)n - (long)iVar16) * 4);
      }
    }
    (scratchMem->delta_w).m_size = n;
    iVar16 = (scratchMem->delta_x).m_size;
    if ((iVar16 <= n) && (iVar16 < n)) {
      if ((scratchMem->delta_x).m_capacity < n) {
        if (n == 0) {
          pfVar9 = (float *)0x0;
        }
        else {
          pfVar9 = (float *)btAlignedAllocInternal((long)n << 2,0x10);
        }
        lVar10 = (long)(scratchMem->delta_x).m_size;
        if (0 < lVar10) {
          pfVar2 = (scratchMem->delta_x).m_data;
          lVar15 = 0;
          do {
            pfVar9[lVar15] = pfVar2[lVar15];
            lVar15 = lVar15 + 1;
          } while (lVar10 != lVar15);
        }
        pfVar2 = (scratchMem->delta_x).m_data;
        if (pfVar2 != (float *)0x0) {
          if ((scratchMem->delta_x).m_ownsMemory == true) {
            btAlignedFreeInternal(pfVar2);
          }
          (scratchMem->delta_x).m_data = (float *)0x0;
        }
        (scratchMem->delta_x).m_ownsMemory = true;
        (scratchMem->delta_x).m_data = pfVar9;
        (scratchMem->delta_x).m_capacity = n;
      }
      if (iVar16 < n) {
        memset((scratchMem->delta_x).m_data + iVar16,0,((long)n - (long)iVar16) * 4);
      }
    }
    (scratchMem->delta_x).m_size = n;
    iVar16 = (scratchMem->Dell).m_size;
    if ((iVar16 <= n) && (iVar16 < n)) {
      if ((scratchMem->Dell).m_capacity < n) {
        if (n == 0) {
          pfVar9 = (float *)0x0;
        }
        else {
          pfVar9 = (float *)btAlignedAllocInternal((long)n << 2,0x10);
        }
        lVar10 = (long)(scratchMem->Dell).m_size;
        if (0 < lVar10) {
          pfVar2 = (scratchMem->Dell).m_data;
          lVar15 = 0;
          do {
            pfVar9[lVar15] = pfVar2[lVar15];
            lVar15 = lVar15 + 1;
          } while (lVar10 != lVar15);
        }
        pfVar2 = (scratchMem->Dell).m_data;
        if (pfVar2 != (float *)0x0) {
          if ((scratchMem->Dell).m_ownsMemory == true) {
            btAlignedFreeInternal(pfVar2);
          }
          (scratchMem->Dell).m_data = (float *)0x0;
        }
        (scratchMem->Dell).m_ownsMemory = true;
        (scratchMem->Dell).m_data = pfVar9;
        (scratchMem->Dell).m_capacity = n;
      }
      if (iVar16 < n) {
        memset((scratchMem->Dell).m_data + iVar16,0,((long)n - (long)iVar16) * 4);
      }
    }
    (scratchMem->Dell).m_size = n;
    iVar16 = (scratchMem->ell).m_size;
    if ((iVar16 <= n) && (iVar16 < n)) {
      if ((scratchMem->ell).m_capacity < n) {
        if (n == 0) {
          pfVar9 = (float *)0x0;
        }
        else {
          pfVar9 = (float *)btAlignedAllocInternal((long)n << 2,0x10);
        }
        lVar10 = (long)(scratchMem->ell).m_size;
        if (0 < lVar10) {
          pfVar2 = (scratchMem->ell).m_data;
          lVar15 = 0;
          do {
            pfVar9[lVar15] = pfVar2[lVar15];
            lVar15 = lVar15 + 1;
          } while (lVar10 != lVar15);
        }
        pfVar2 = (scratchMem->ell).m_data;
        if (pfVar2 != (float *)0x0) {
          if ((scratchMem->ell).m_ownsMemory == true) {
            btAlignedFreeInternal(pfVar2);
          }
          (scratchMem->ell).m_data = (float *)0x0;
        }
        (scratchMem->ell).m_ownsMemory = true;
        (scratchMem->ell).m_data = pfVar9;
        (scratchMem->ell).m_capacity = n;
      }
      if (iVar16 < n) {
        memset((scratchMem->ell).m_data + iVar16,0,((long)n - (long)iVar16) * 4);
      }
    }
    (scratchMem->ell).m_size = n;
    iVar16 = *(int *)&scratchMem->field_0xe4;
    lVar10 = (long)iVar16;
    if ((iVar16 <= n) && (iVar16 < n)) {
      if (*(int *)&scratchMem->field_0xe8 < n) {
        if (n == 0) {
          pvVar11 = (void *)0x0;
        }
        else {
          pvVar11 = btAlignedAllocInternal((long)n << 3,0x10);
        }
        iVar17 = *(int *)&scratchMem->field_0xe4;
        if (0 < (long)iVar17) {
          lVar15 = 0;
          do {
            *(undefined8 *)((long)pvVar11 + lVar15 * 8) =
                 *(undefined8 *)(*(long *)&scratchMem->field_0xf0 + lVar15 * 8);
            lVar15 = lVar15 + 1;
          } while (iVar17 != lVar15);
        }
        if (*(void **)&scratchMem->field_0xf0 != (void *)0x0) {
          if (scratchMem->field_0xf8 == '\x01') {
            btAlignedFreeInternal(*(void **)&scratchMem->field_0xf0);
          }
          *(undefined8 *)&scratchMem->field_0xf0 = 0;
        }
        scratchMem->field_0xf8 = 1;
        *(void **)&scratchMem->field_0xf0 = pvVar11;
        *(int *)&scratchMem->field_0xe8 = n;
      }
      if (iVar16 < n) {
        do {
          *(undefined8 *)(*(long *)&scratchMem->field_0xf0 + lVar10 * 8) = 0;
          lVar10 = lVar10 + 1;
        } while (n != lVar10);
      }
    }
    *(int *)&scratchMem->field_0xe4 = n;
    iVar16 = (scratchMem->p).m_size;
    if ((iVar16 <= n) && (iVar16 < n)) {
      if ((scratchMem->p).m_capacity < n) {
        if (n == 0) {
          piVar12 = (int *)0x0;
        }
        else {
          piVar12 = (int *)btAlignedAllocInternal((long)n << 2,0x10);
        }
        lVar10 = (long)(scratchMem->p).m_size;
        if (0 < lVar10) {
          piVar3 = (scratchMem->p).m_data;
          lVar15 = 0;
          do {
            piVar12[lVar15] = piVar3[lVar15];
            lVar15 = lVar15 + 1;
          } while (lVar10 != lVar15);
        }
        piVar3 = (scratchMem->p).m_data;
        if (piVar3 != (int *)0x0) {
          if ((scratchMem->p).m_ownsMemory == true) {
            btAlignedFreeInternal(piVar3);
          }
          (scratchMem->p).m_data = (int *)0x0;
        }
        (scratchMem->p).m_ownsMemory = true;
        (scratchMem->p).m_data = piVar12;
        (scratchMem->p).m_capacity = n;
      }
      if (iVar16 < n) {
        memset((scratchMem->p).m_data + iVar16,0,((long)n - (long)iVar16) * 4);
      }
    }
    (scratchMem->p).m_size = n;
    iVar16 = (scratchMem->C).m_size;
    if ((iVar16 <= n) && (iVar16 < n)) {
      if ((scratchMem->C).m_capacity < n) {
        if (n == 0) {
          piVar12 = (int *)0x0;
        }
        else {
          piVar12 = (int *)btAlignedAllocInternal((long)n << 2,0x10);
        }
        lVar10 = (long)(scratchMem->C).m_size;
        if (0 < lVar10) {
          piVar3 = (scratchMem->C).m_data;
          lVar15 = 0;
          do {
            piVar12[lVar15] = piVar3[lVar15];
            lVar15 = lVar15 + 1;
          } while (lVar10 != lVar15);
        }
        piVar3 = (scratchMem->C).m_data;
        if (piVar3 != (int *)0x0) {
          if ((scratchMem->C).m_ownsMemory == true) {
            btAlignedFreeInternal(piVar3);
          }
          (scratchMem->C).m_data = (int *)0x0;
        }
        (scratchMem->C).m_ownsMemory = true;
        (scratchMem->C).m_data = piVar12;
        (scratchMem->C).m_capacity = n;
      }
      if (iVar16 < n) {
        memset((scratchMem->C).m_data + iVar16,0,((long)n - (long)iVar16) * 4);
      }
    }
    (scratchMem->C).m_size = n;
    iVar16 = (scratchMem->state).m_size;
    if ((iVar16 <= n) && (iVar16 < n)) {
      if ((scratchMem->state).m_capacity < n) {
        if (n == 0) {
          pbVar13 = (bool *)0x0;
        }
        else {
          pbVar13 = (bool *)btAlignedAllocInternal((long)n,0x10);
        }
        lVar10 = (long)(scratchMem->state).m_size;
        if (0 < lVar10) {
          pbVar4 = (scratchMem->state).m_data;
          lVar15 = 0;
          do {
            pbVar13[lVar15] = pbVar4[lVar15];
            lVar15 = lVar15 + 1;
          } while (lVar10 != lVar15);
        }
        pbVar4 = (scratchMem->state).m_data;
        if (pbVar4 != (bool *)0x0) {
          if ((scratchMem->state).m_ownsMemory == true) {
            btAlignedFreeInternal(pbVar4);
          }
          (scratchMem->state).m_data = (bool *)0x0;
        }
        (scratchMem->state).m_ownsMemory = true;
        (scratchMem->state).m_data = pbVar13;
        (scratchMem->state).m_capacity = n;
      }
      if (iVar16 < n) {
        memset((scratchMem->state).m_data + iVar16,0,(long)n - (long)iVar16);
      }
    }
    (scratchMem->state).m_size = n;
    btLCP::btLCP(&lcp,n,n,nub,A,x,b,outer_w,lo,hi,(scratchMem->L).m_data,(scratchMem->d).m_data,
                 (scratchMem->Dell).m_data,(scratchMem->ell).m_data,(scratchMem->delta_w).m_data,
                 (scratchMem->state).m_data,findex,(scratchMem->p).m_data,(scratchMem->C).m_data,
                 *(btScalar ***)&scratchMem->field_0xf0);
    lVar10 = (long)lcp.m_nub;
    if (lcp.m_nub < n) {
      bVar8 = false;
      lVar15 = lVar10;
      do {
        s_error = false;
        if ((findex != (int *)0x0 && !bVar8) && (-1 < findex[lVar15])) {
          if (0 < n) {
            pfVar9 = (scratchMem->delta_w).m_data;
            piVar12 = (scratchMem->p).m_data;
            uVar19 = 0;
            do {
              pfVar9[piVar12[uVar19]] = x[uVar19];
              uVar19 = uVar19 + 1;
            } while ((uint)n != uVar19);
          }
          pfVar9 = (scratchMem->delta_w).m_data;
          lVar14 = lVar15;
          do {
            fVar24 = pfVar9[findex[lVar14]];
            if ((fVar24 != 0.0) || (NAN(fVar24))) {
              fVar1 = hi[lVar14];
              hi[lVar14] = ABS(fVar24 * fVar1);
              bVar22 = (btScalar)((uint)(fVar24 * fVar1) | 0x80000000);
            }
            else {
              hi[lVar14] = 0.0;
              bVar22 = 0.0;
            }
            lo[lVar14] = bVar22;
            lVar14 = lVar14 + 1;
          } while (lVar14 < n);
          bVar8 = true;
        }
        iVar16 = (int)lVar15;
        bVar22 = btLCP::AiC_times_qC(&lcp,iVar16,x);
        bVar23 = btLCP::AiN_times_qN(&lcp,iVar16,x);
        fVar24 = (bVar23 + bVar22) - b[lVar15];
        outer_w[lVar15] = fVar24;
        if (((lo[lVar15] != 0.0) || (NAN(lo[lVar15]))) || (fVar24 < 0.0)) {
          if (((hi[lVar15] != 0.0) || (NAN(hi[lVar15]))) || (0.0 < fVar24)) {
            if ((fVar24 != 0.0) || (NAN(fVar24))) {
              pfVar9 = outer_w + lVar15;
              do {
                fVar24 = *pfVar9;
                uVar21 = -(uint)(0.0 < fVar24) | 1;
                btLCP::solve1(&lcp,(scratchMem->delta_x).m_data,iVar16,uVar21,0);
                btLCP::pN_equals_ANC_times_qC
                          (&lcp,(scratchMem->delta_w).m_data,(scratchMem->delta_x).m_data);
                btLCP::pN_plusequals_ANi(&lcp,(scratchMem->delta_w).m_data,iVar16,uVar21);
                bVar22 = btLCP::AiC_times_qC(&lcp,iVar16,(scratchMem->delta_x).m_data);
                fVar1 = *(float *)(&DAT_001f6ec8 + (ulong)(0.0 >= fVar24) * 4);
                fVar25 = lcp.m_A[lVar15][lVar15] * fVar1 + bVar22;
                pfVar2 = (scratchMem->delta_w).m_data;
                pfVar2[lVar15] = fVar25;
                fVar25 = -*pfVar9 / fVar25;
                if (0.0 < fVar24) {
                  fVar24 = lo[lVar15];
                  uVar21 = 2;
                  if (fVar24 == -INFINITY) goto LAB_001d30b3;
LAB_001d30e9:
                  fVar24 = (fVar24 - x[lVar15]) * fVar1;
                  if (fVar25 <= fVar24) {
                    uVar21 = 1;
                    fVar24 = fVar25;
                  }
                }
                else {
                  fVar24 = hi[lVar15];
                  uVar21 = 3;
                  if (fVar24 != INFINITY) goto LAB_001d30e9;
LAB_001d30b3:
                  uVar21 = 1;
                  fVar24 = fVar25;
                }
                lVar14 = (long)lcp.m_nN;
                if (lVar14 < 1) {
                  iVar17 = 0;
                }
                else {
                  lVar18 = (long)lcp.m_nC;
                  lVar20 = 0;
                  iVar17 = 0;
                  do {
                    if ((scratchMem->state).m_data[lVar20 + lVar18] == false) {
                      if (pfVar2[lVar18 + lVar20] < 0.0) goto LAB_001d3172;
                    }
                    else if (0.0 < pfVar2[lVar18 + lVar20]) {
LAB_001d3172:
                      if ((((lo[lVar18 + lVar20] != 0.0) || (NAN(lo[lVar18 + lVar20]))) ||
                          (hi[lVar18 + lVar20] != 0.0)) || (NAN(hi[lVar18 + lVar20]))) {
                        fVar26 = -outer_w[lVar18 + lVar20] / pfVar2[lVar18 + lVar20];
                        fVar25 = fVar26;
                        iVar7 = lcp.m_nC + (int)lVar20;
                        if (fVar24 <= fVar26) {
                          fVar25 = fVar24;
                          iVar7 = iVar17;
                        }
                        iVar17 = iVar7;
                        bVar6 = fVar26 < fVar24;
                        fVar24 = fVar25;
                        if (bVar6) {
                          uVar21 = 4;
                        }
                      }
                    }
                    lVar20 = lVar20 + 1;
                  } while (lVar14 != lVar20);
                }
                lVar18 = (long)lcp.m_nC;
                if (lcp.m_nub < lcp.m_nC) {
                  lVar20 = 0;
                  do {
                    fVar25 = (scratchMem->delta_x).m_data[lVar10 + lVar20];
                    if ((fVar25 < 0.0) && (lo[lVar10 + lVar20] != -INFINITY)) {
                      fVar26 = (lo[lVar10 + lVar20] - x[lVar10 + lVar20]) / fVar25;
                      if (fVar26 < fVar24) {
                        uVar21 = 5;
                        iVar17 = (int)lVar20 + lcp.m_nub;
                        fVar24 = fVar26;
                      }
                    }
                    if ((0.0 < fVar25) && (hi[lVar10 + lVar20] != INFINITY)) {
                      fVar25 = (hi[lVar10 + lVar20] - x[lVar10 + lVar20]) / fVar25;
                      fVar26 = fVar25;
                      iVar7 = (int)lVar20 + lcp.m_nub;
                      if (fVar24 <= fVar25) {
                        fVar26 = fVar24;
                        iVar7 = iVar17;
                      }
                      iVar17 = iVar7;
                      bVar6 = fVar25 < fVar24;
                      fVar24 = fVar26;
                      if (bVar6) {
                        uVar21 = 6;
                      }
                    }
                    lVar20 = lVar20 + 1;
                  } while (lVar18 - lVar10 != lVar20);
                }
                if (fVar24 <= 0.0) {
                  __n = (n - lVar15) * 4;
                  memset(x + lVar15,0,__n);
                  memset(pfVar9,0,__n);
                  s_error = true;
                  break;
                }
                if (0 < lcp.m_nC) {
                  pfVar5 = (scratchMem->delta_x).m_data;
                  uVar19 = 0;
                  do {
                    x[uVar19] = pfVar5[uVar19] * fVar24 + x[uVar19];
                    uVar19 = uVar19 + 1;
                  } while ((uint)lcp.m_nC != uVar19);
                }
                x[lVar15] = fVar1 * fVar24 + x[lVar15];
                if (0 < lcp.m_nN) {
                  lVar20 = 0;
                  do {
                    outer_w[lVar18 + lVar20] =
                         pfVar2[lVar18 + lVar20] * fVar24 + outer_w[lVar18 + lVar20];
                    lVar20 = lVar20 + 1;
                  } while (lVar14 != lVar20);
                }
                *pfVar9 = fVar24 * pfVar2[lVar15] + *pfVar9;
                switch(uVar21) {
                case 1:
                  *pfVar9 = 0.0;
                  btLCP::transfer_i_to_C(&lcp,iVar16);
                  break;
                case 2:
                  x[lVar15] = lo[lVar15];
                  (scratchMem->state).m_data[lVar15] = false;
                  goto LAB_001d33ca;
                case 3:
                  x[lVar15] = hi[lVar15];
                  (scratchMem->state).m_data[lVar15] = true;
LAB_001d33ca:
                  lcp.m_nN = lcp.m_nN + 1;
                  break;
                case 4:
                  outer_w[iVar17] = 0.0;
                  btLCP::transfer_i_from_N_to_C(&lcp,iVar17);
                  break;
                case 5:
                  x[iVar17] = lo[iVar17];
                  (scratchMem->state).m_data[iVar17] = false;
                  goto LAB_001d33fb;
                case 6:
                  x[iVar17] = hi[iVar17];
                  (scratchMem->state).m_data[iVar17] = true;
LAB_001d33fb:
                  btLCP::transfer_i_from_C_to_N(&lcp,iVar17,&scratchMem->m_scratch);
                }
              } while (3 < uVar21);
            }
            else {
              btLCP::solve1(&lcp,(scratchMem->delta_x).m_data,iVar16,0,1);
              btLCP::transfer_i_to_C(&lcp,iVar16);
            }
          }
          else {
            lcp.m_nN = lcp.m_nN + 1;
            (scratchMem->state).m_data[lVar15] = true;
          }
        }
        else {
          lcp.m_nN = lcp.m_nN + 1;
          (scratchMem->state).m_data[lVar15] = false;
        }
      } while ((s_error == false) && (lVar15 = lVar15 + 1, (int)lVar15 != n));
    }
    btLCP::unpermute(&lcp);
  }
  else {
    btFactorLDLT(A,outer_w,n,n);
    btSolveLDLT(A,outer_w,b,n,n);
    memcpy(x,b,(long)n << 2);
  }
  return (bool)(s_error ^ 1);
}

Assistant:

bool btSolveDantzigLCP (int n, btScalar *A, btScalar *x, btScalar *b,
                btScalar* outer_w, int nub, btScalar *lo, btScalar *hi, int *findex, btDantzigScratchMemory& scratchMem)
{
	s_error = false;

//	printf("btSolveDantzigLCP n=%d\n",n);
  btAssert (n>0 && A && x && b && lo && hi && nub >= 0 && nub <= n);
  btAssert(outer_w);

#ifdef BT_DEBUG
  {
    // check restrictions on lo and hi
    for (int k=0; k<n; ++k) 
		btAssert (lo[k] <= 0 && hi[k] >= 0);
  }
# endif


  // if all the variables are unbounded then we can just factor, solve,
  // and return
  if (nub >= n) 
  {
   

    int nskip = (n);
    btFactorLDLT (A, outer_w, n, nskip);
    btSolveLDLT (A, outer_w, b, n, nskip);
    memcpy (x, b, n*sizeof(btScalar));

    return !s_error;
  }

  const int nskip = (n);
  scratchMem.L.resize(n*nskip);

  scratchMem.d.resize(n);

  btScalar *w = outer_w;
  scratchMem.delta_w.resize(n);
  scratchMem.delta_x.resize(n);
  scratchMem.Dell.resize(n);
  scratchMem.ell.resize(n);
  scratchMem.Arows.resize(n);
  scratchMem.p.resize(n);
  scratchMem.C.resize(n);

  // for i in N, state[i] is 0 if x(i)==lo(i) or 1 if x(i)==hi(i)
  scratchMem.state.resize(n);


  // create LCP object. note that tmp is set to delta_w to save space, this
  // optimization relies on knowledge of how tmp is used, so be careful!
  btLCP lcp(n,nskip,nub,A,x,b,w,lo,hi,&scratchMem.L[0],&scratchMem.d[0],&scratchMem.Dell[0],&scratchMem.ell[0],&scratchMem.delta_w[0],&scratchMem.state[0],findex,&scratchMem.p[0],&scratchMem.C[0],&scratchMem.Arows[0]);
  int adj_nub = lcp.getNub();

  // loop over all indexes adj_nub..n-1. for index i, if x(i),w(i) satisfy the
  // LCP conditions then i is added to the appropriate index set. otherwise
  // x(i),w(i) is driven either +ve or -ve to force it to the valid region.
  // as we drive x(i), x(C) is also adjusted to keep w(C) at zero.
  // while driving x(i) we maintain the LCP conditions on the other variables
  // 0..i-1. we do this by watching out for other x(i),w(i) values going
  // outside the valid region, and then switching them between index sets
  // when that happens.

  bool hit_first_friction_index = false;
  for (int i=adj_nub; i<n; ++i) 
  {
    s_error = false;
    // the index i is the driving index and indexes i+1..n-1 are "dont care",
    // i.e. when we make changes to the system those x's will be zero and we
    // don't care what happens to those w's. in other words, we only consider
    // an (i+1)*(i+1) sub-problem of A*x=b+w.

    // if we've hit the first friction index, we have to compute the lo and
    // hi values based on the values of x already computed. we have been
    // permuting the indexes, so the values stored in the findex vector are
    // no longer valid. thus we have to temporarily unpermute the x vector. 
    // for the purposes of this computation, 0*infinity = 0 ... so if the
    // contact constraint's normal force is 0, there should be no tangential
    // force applied.

    if (!hit_first_friction_index && findex && findex[i] >= 0) {
      // un-permute x into delta_w, which is not being used at the moment
      for (int j=0; j<n; ++j) scratchMem.delta_w[scratchMem.p[j]] = x[j];

      // set lo and hi values
      for (int k=i; k<n; ++k) {
        btScalar wfk = scratchMem.delta_w[findex[k]];
        if (wfk == 0) {
          hi[k] = 0;
          lo[k] = 0;
        }
        else {
          hi[k] = btFabs (hi[k] * wfk);
          lo[k] = -hi[k];
        }
      }
      hit_first_friction_index = true;
    }

    // thus far we have not even been computing the w values for indexes
    // greater than i, so compute w[i] now.
    w[i] = lcp.AiC_times_qC (i,x) + lcp.AiN_times_qN (i,x) - b[i];

    // if lo=hi=0 (which can happen for tangential friction when normals are
    // 0) then the index will be assigned to set N with some state. however,
    // set C's line has zero size, so the index will always remain in set N.
    // with the "normal" switching logic, if w changed sign then the index
    // would have to switch to set C and then back to set N with an inverted
    // state. this is pointless, and also computationally expensive. to
    // prevent this from happening, we use the rule that indexes with lo=hi=0
    // will never be checked for set changes. this means that the state for
    // these indexes may be incorrect, but that doesn't matter.

    // see if x(i),w(i) is in a valid region
    if (lo[i]==0 && w[i] >= 0) {
      lcp.transfer_i_to_N (i);
      scratchMem.state[i] = false;
    }
    else if (hi[i]==0 && w[i] <= 0) {
      lcp.transfer_i_to_N (i);
      scratchMem.state[i] = true;
    }
    else if (w[i]==0) {
      // this is a degenerate case. by the time we get to this test we know
      // that lo != 0, which means that lo < 0 as lo is not allowed to be +ve,
      // and similarly that hi > 0. this means that the line segment
      // corresponding to set C is at least finite in extent, and we are on it.
      // NOTE: we must call lcp.solve1() before lcp.transfer_i_to_C()
      lcp.solve1 (&scratchMem.delta_x[0],i,0,1);

      lcp.transfer_i_to_C (i);
    }
    else {
      // we must push x(i) and w(i)
      for (;;) {
        int dir;
        btScalar dirf;
        // find direction to push on x(i)
        if (w[i] <= 0) {
          dir = 1;
          dirf = btScalar(1.0);
        }
        else {
          dir = -1;
          dirf = btScalar(-1.0);
        }

        // compute: delta_x(C) = -dir*A(C,C)\A(C,i)
        lcp.solve1 (&scratchMem.delta_x[0],i,dir);

        // note that delta_x[i] = dirf, but we wont bother to set it

        // compute: delta_w = A*delta_x ... note we only care about
        // delta_w(N) and delta_w(i), the rest is ignored
        lcp.pN_equals_ANC_times_qC (&scratchMem.delta_w[0],&scratchMem.delta_x[0]);
        lcp.pN_plusequals_ANi (&scratchMem.delta_w[0],i,dir);
        scratchMem.delta_w[i] = lcp.AiC_times_qC (i,&scratchMem.delta_x[0]) + lcp.Aii(i)*dirf;

        // find largest step we can take (size=s), either to drive x(i),w(i)
        // to the valid LCP region or to drive an already-valid variable
        // outside the valid region.

        int cmd = 1;		// index switching command
        int si = 0;		// si = index to switch if cmd>3
        btScalar s = -w[i]/scratchMem.delta_w[i];
        if (dir > 0) {
          if (hi[i] < BT_INFINITY) {
            btScalar s2 = (hi[i]-x[i])*dirf;	// was (hi[i]-x[i])/dirf	// step to x(i)=hi(i)
            if (s2 < s) {
              s = s2;
              cmd = 3;
            }
          }
        }
        else {
          if (lo[i] > -BT_INFINITY) {
            btScalar s2 = (lo[i]-x[i])*dirf;	// was (lo[i]-x[i])/dirf	// step to x(i)=lo(i)
            if (s2 < s) {
              s = s2;
              cmd = 2;
            }
          }
        }

        {
          const int numN = lcp.numN();
          for (int k=0; k < numN; ++k) {
            const int indexN_k = lcp.indexN(k);
            if (!scratchMem.state[indexN_k] ? scratchMem.delta_w[indexN_k] < 0 : scratchMem.delta_w[indexN_k] > 0) {
                // don't bother checking if lo=hi=0
                if (lo[indexN_k] == 0 && hi[indexN_k] == 0) continue;
                btScalar s2 = -w[indexN_k] / scratchMem.delta_w[indexN_k];
                if (s2 < s) {
                  s = s2;
                  cmd = 4;
                  si = indexN_k;
                }
            }
          }
        }

        {
          const int numC = lcp.numC();
          for (int k=adj_nub; k < numC; ++k) {
            const int indexC_k = lcp.indexC(k);
            if (scratchMem.delta_x[indexC_k] < 0 && lo[indexC_k] > -BT_INFINITY) {
              btScalar s2 = (lo[indexC_k]-x[indexC_k]) / scratchMem.delta_x[indexC_k];
              if (s2 < s) {
                s = s2;
                cmd = 5;
                si = indexC_k;
              }
            }
            if (scratchMem.delta_x[indexC_k] > 0 && hi[indexC_k] < BT_INFINITY) {
              btScalar s2 = (hi[indexC_k]-x[indexC_k]) / scratchMem.delta_x[indexC_k];
              if (s2 < s) {
                s = s2;
                cmd = 6;
                si = indexC_k;
              }
            }
          }
        }

        //static char* cmdstring[8] = {0,"->C","->NL","->NH","N->C",
        //			     "C->NL","C->NH"};
        //printf ("cmd=%d (%s), si=%d\n",cmd,cmdstring[cmd],(cmd>3) ? si : i);

        // if s <= 0 then we've got a problem. if we just keep going then
        // we're going to get stuck in an infinite loop. instead, just cross
        // our fingers and exit with the current solution.
        if (s <= btScalar(0.0)) 
		{
//          printf("LCP internal error, s <= 0 (s=%.4e)",(double)s);
          if (i < n) {
            btSetZero (x+i,n-i);
            btSetZero (w+i,n-i);
          }
          s_error = true;
          break;
        }

        // apply x = x + s * delta_x
        lcp.pC_plusequals_s_times_qC (x, s, &scratchMem.delta_x[0]);
        x[i] += s * dirf;

        // apply w = w + s * delta_w
        lcp.pN_plusequals_s_times_qN (w, s, &scratchMem.delta_w[0]);
        w[i] += s * scratchMem.delta_w[i];

//        void *tmpbuf;
        // switch indexes between sets if necessary
        switch (cmd) {
        case 1:		// done
          w[i] = 0;
          lcp.transfer_i_to_C (i);
          break;
        case 2:		// done
          x[i] = lo[i];
          scratchMem.state[i] = false;
          lcp.transfer_i_to_N (i);
          break;
        case 3:		// done
          x[i] = hi[i];
          scratchMem.state[i] = true;
          lcp.transfer_i_to_N (i);
          break;
        case 4:		// keep going
          w[si] = 0;
          lcp.transfer_i_from_N_to_C (si);
          break;
        case 5:		// keep going
          x[si] = lo[si];
          scratchMem.state[si] = false;
		  lcp.transfer_i_from_C_to_N (si, scratchMem.m_scratch);
          break;
        case 6:		// keep going
          x[si] = hi[si];
          scratchMem.state[si] = true;
          lcp.transfer_i_from_C_to_N (si, scratchMem.m_scratch);
          break;
        }

        if (cmd <= 3) break;
      } // for (;;)
    } // else

    if (s_error) 
	{
      break;
    }
  } // for (int i=adj_nub; i<n; ++i)

  lcp.unpermute();


  return !s_error;
}